

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibScl.c
# Opt level: O1

void Abc_SclReadSurfaceGenlib(SC_Surface *p)

{
  uint uVar1;
  float *pfVar2;
  uint *puVar3;
  void *pvVar4;
  void **ppvVar5;
  Vec_Int_t *p_00;
  int *piVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  
  uVar1 = (p->vIndex0).nCap;
  if ((p->vIndex0).nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      pfVar2 = (p->vIndex0).pArray;
      if (pfVar2 == (float *)0x0) {
        pfVar2 = (float *)malloc(0x40);
      }
      else {
        pfVar2 = (float *)realloc(pfVar2,0x40);
      }
      (p->vIndex0).pArray = pfVar2;
      iVar8 = 0x10;
    }
    else {
      iVar8 = uVar1 * 2;
      if (iVar8 <= (int)uVar1) goto LAB_0046c82a;
      pfVar2 = (p->vIndex0).pArray;
      if (pfVar2 == (float *)0x0) {
        pfVar2 = (float *)malloc((ulong)uVar1 << 3);
      }
      else {
        pfVar2 = (float *)realloc(pfVar2,(ulong)uVar1 << 3);
      }
      (p->vIndex0).pArray = pfVar2;
    }
    (p->vIndex0).nCap = iVar8;
  }
LAB_0046c82a:
  iVar8 = (p->vIndex0).nSize;
  (p->vIndex0).nSize = iVar8 + 1;
  (p->vIndex0).pArray[iVar8] = 0.0;
  Vec_IntPush(&p->vIndex0I,0);
  uVar1 = (p->vIndex1).nCap;
  if ((p->vIndex1).nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      pfVar2 = (p->vIndex1).pArray;
      if (pfVar2 == (float *)0x0) {
        pfVar2 = (float *)malloc(0x40);
      }
      else {
        pfVar2 = (float *)realloc(pfVar2,0x40);
      }
      (p->vIndex1).pArray = pfVar2;
      iVar8 = 0x10;
    }
    else {
      iVar8 = uVar1 * 2;
      if (iVar8 <= (int)uVar1) goto LAB_0046c8b7;
      pfVar2 = (p->vIndex1).pArray;
      if (pfVar2 == (float *)0x0) {
        pfVar2 = (float *)malloc((ulong)uVar1 << 3);
      }
      else {
        pfVar2 = (float *)realloc(pfVar2,(ulong)uVar1 << 3);
      }
      (p->vIndex1).pArray = pfVar2;
    }
    (p->vIndex1).nCap = iVar8;
  }
LAB_0046c8b7:
  iVar8 = (p->vIndex1).nSize;
  (p->vIndex1).nSize = iVar8 + 1;
  (p->vIndex1).pArray[iVar8] = 0.0;
  iVar8 = 0;
  Vec_IntPush(&p->vIndex1I,0);
  if (0 < (p->vIndex0).nSize) {
    do {
      uVar1 = (p->vIndex1).nSize;
      puVar3 = (uint *)malloc(0x10);
      if (uVar1 - 1 < 0xf) {
        uVar1 = 0x10;
      }
      puVar3[1] = 0;
      *puVar3 = uVar1;
      if (uVar1 == 0) {
        pvVar4 = (void *)0x0;
      }
      else {
        pvVar4 = malloc((long)(int)uVar1 << 2);
      }
      *(void **)(puVar3 + 2) = pvVar4;
      uVar1 = (p->vData).nCap;
      if ((p->vData).nSize == uVar1) {
        if ((int)uVar1 < 0x10) {
          ppvVar5 = (p->vData).pArray;
          if (ppvVar5 == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(ppvVar5,0x80);
          }
          (p->vData).pArray = ppvVar5;
          iVar9 = 0x10;
        }
        else {
          iVar9 = uVar1 * 2;
          if (iVar9 <= (int)uVar1) goto LAB_0046c995;
          ppvVar5 = (p->vData).pArray;
          if (ppvVar5 == (void **)0x0) {
            ppvVar5 = (void **)malloc((ulong)uVar1 << 4);
          }
          else {
            ppvVar5 = (void **)realloc(ppvVar5,(ulong)uVar1 << 4);
          }
          (p->vData).pArray = ppvVar5;
        }
        (p->vData).nCap = iVar9;
      }
LAB_0046c995:
      iVar9 = (p->vData).nSize;
      (p->vData).nSize = iVar9 + 1;
      (p->vData).pArray[iVar9] = puVar3;
      uVar1 = (p->vIndex1).nSize;
      p_00 = (Vec_Int_t *)malloc(0x10);
      if (uVar1 - 1 < 0xf) {
        uVar1 = 0x10;
      }
      p_00->nSize = 0;
      p_00->nCap = uVar1;
      if (uVar1 == 0) {
        piVar6 = (int *)0x0;
      }
      else {
        piVar6 = (int *)malloc((long)(int)uVar1 << 2);
      }
      p_00->pArray = piVar6;
      uVar1 = (p->vDataI).nCap;
      if ((p->vDataI).nSize == uVar1) {
        if ((int)uVar1 < 0x10) {
          ppvVar5 = (p->vDataI).pArray;
          if (ppvVar5 == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(ppvVar5,0x80);
          }
          (p->vDataI).pArray = ppvVar5;
          iVar9 = 0x10;
        }
        else {
          iVar9 = uVar1 * 2;
          if (iVar9 <= (int)uVar1) goto LAB_0046ca53;
          ppvVar5 = (p->vDataI).pArray;
          if (ppvVar5 == (void **)0x0) {
            ppvVar5 = (void **)malloc((ulong)uVar1 << 4);
          }
          else {
            ppvVar5 = (void **)realloc(ppvVar5,(ulong)uVar1 << 4);
          }
          (p->vDataI).pArray = ppvVar5;
        }
        (p->vDataI).nCap = iVar9;
      }
LAB_0046ca53:
      iVar9 = (p->vDataI).nSize;
      (p->vDataI).nSize = iVar9 + 1;
      (p->vDataI).pArray[iVar9] = p_00;
      if (0 < (p->vIndex1).nSize) {
        iVar9 = 0;
        do {
          uVar1 = *puVar3;
          if (puVar3[1] == uVar1) {
            if ((int)uVar1 < 0x10) {
              if (*(void **)(puVar3 + 2) == (void *)0x0) {
                pvVar4 = malloc(0x40);
              }
              else {
                pvVar4 = realloc(*(void **)(puVar3 + 2),0x40);
              }
              uVar7 = 0x10;
            }
            else {
              uVar7 = uVar1 * 2;
              if ((int)uVar7 <= (int)uVar1) goto LAB_0046cacb;
              if (*(void **)(puVar3 + 2) == (void *)0x0) {
                pvVar4 = malloc((ulong)uVar1 << 3);
              }
              else {
                pvVar4 = realloc(*(void **)(puVar3 + 2),(ulong)uVar1 << 3);
              }
            }
            *(void **)(puVar3 + 2) = pvVar4;
            *puVar3 = uVar7;
          }
LAB_0046cacb:
          uVar1 = puVar3[1];
          puVar3[1] = uVar1 + 1;
          *(undefined4 *)(*(long *)(puVar3 + 2) + (long)(int)uVar1 * 4) = 0x3f800000;
          Vec_IntPush(p_00,1000);
          iVar9 = iVar9 + 1;
        } while (iVar9 < (p->vIndex1).nSize);
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 < (p->vIndex0).nSize);
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////


/**Function*************************************************************

  Synopsis    [Reading library from file.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
static void Abc_SclReadSurfaceGenlib( SC_Surface * p )
{
    Vec_Flt_t * vVec;
    Vec_Int_t * vVecI;
    int i, j;

    Vec_FltPush( &p->vIndex0, 0 );
    Vec_IntPush( &p->vIndex0I, Scl_Flt2Int(0) );

    Vec_FltPush( &p->vIndex1, 0 );
    Vec_IntPush( &p->vIndex1I, Scl_Flt2Int(0) );

    for ( i = 0; i < Vec_FltSize(&p->vIndex0); i++ )
    {
        vVec = Vec_FltAlloc( Vec_FltSize(&p->vIndex1) );
        Vec_PtrPush( &p->vData, vVec );
        vVecI = Vec_IntAlloc( Vec_FltSize(&p->vIndex1) );
        Vec_PtrPush( &p->vDataI, vVecI );
        for ( j = 0; j < Vec_FltSize(&p->vIndex1); j++ )
        {
            Vec_FltPush( vVec, 1 );
            Vec_IntPush( vVecI, Scl_Flt2Int(1) );
        }
    }
}